

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::PrintSExpression::visitImportedFunction(PrintSExpression *this,Function *curr)

{
  Function *curr_local;
  PrintSExpression *this_local;
  
  doIndent(this->o,this->indent);
  this->currFunction = curr;
  std::optional<wasm::Function::DebugLocation>::operator=(&this->lastPrintedLocation);
  std::operator<<(this->o,'(');
  emitImportHeader(this,&curr->super_Importable);
  handleSignature(this,curr,false);
  std::operator<<(this->o,"))");
  std::operator<<(this->o,this->maybeNewLine);
  return;
}

Assistant:

void PrintSExpression::visitImportedFunction(Function* curr) {
  doIndent(o, indent);
  currFunction = curr;
  lastPrintedLocation = std::nullopt;
  o << '(';
  emitImportHeader(curr);
  handleSignature(curr);
  o << "))";
  o << maybeNewLine;
}